

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

void P_AutoUseStrifeHealth(player_t *player)

{
  byte bVar1;
  APlayerPawn *pAVar2;
  APlayerPawn *pAVar3;
  APlayerPawn *pAVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  TArray<AInventory_*,_AInventory_*> Items;
  TArray<AInventory_*,_AInventory_*> local_48;
  PClass *pPVar7;
  
  local_48.Array = (AInventory **)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  pAVar2 = (APlayerPawn *)(player->mo->super_AActor).Inventory.field_0.p;
  if (pAVar2 != (APlayerPawn *)0x0) {
    bVar1 = (byte)(pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags;
    pAVar4 = player->mo;
    pPVar5 = AHealthPickup::RegistrationInfo.MyClass;
    while (AHealthPickup::RegistrationInfo.MyClass = pPVar5, (bVar1 & 0x20) == 0) {
      if (0 < pAVar2->RunHealth) {
        pPVar7 = (pAVar2->super_AActor).super_DThinker.super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar6 = (**(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar2);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
          (pAVar2->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
        }
        bVar12 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar12) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar12 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if ((bVar12) && (*(int *)((FSoundIDNoInit *)&pAVar2->FallingScreamMaxSpeed + 1) == 3)) {
          TArray<AInventory_*,_AInventory_*>::Grow(&local_48,1);
          local_48.Array[local_48.Count] = (AInventory *)pAVar2;
          local_48.Count = local_48.Count + 1;
        }
      }
      pAVar3 = (APlayerPawn *)(pAVar2->super_AActor).Inventory.field_0.p;
      if (pAVar3 == (APlayerPawn *)0x0) goto LAB_003fe63c;
      pAVar4 = pAVar2;
      pAVar2 = pAVar3;
      pPVar5 = AHealthPickup::RegistrationInfo.MyClass;
      bVar1 = (byte)(pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags;
    }
    (pAVar4->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
  }
LAB_003fe63c:
  if (sv_disableautohealth.Value != false) {
LAB_003fe645:
    TArray<AInventory_*,_AInventory_*>::~TArray(&local_48);
    return;
  }
  do {
    uVar8 = local_48.Count;
    do {
      do {
        if (uVar8 == 0) goto LAB_003fe645;
        uVar9 = 0;
        uVar11 = 0xffffffff;
        iVar6 = 0;
        do {
          if (iVar6 < (local_48.Array[uVar9]->super_AActor).health) {
            iVar6 = local_48.Array[uVar9]->Amount;
            uVar11 = uVar9 & 0xffffffff;
          }
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
        uVar10 = (uint)uVar11;
        do {
          if (0x31 < player->health) goto LAB_003fe645;
          iVar6 = (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x17])();
        } while ((char)iVar6 != '\0');
        if (0x31 < player->health) goto LAB_003fe645;
        uVar8 = local_48.Count;
      } while (local_48.Count <= uVar10);
      uVar8 = local_48.Count - 1;
      local_48.Count = uVar8;
    } while (uVar8 < uVar10 || uVar8 - uVar10 == 0);
    memmove(local_48.Array + uVar11,local_48.Array + uVar11 + 1,(ulong)(uVar8 - uVar10) << 3);
  } while( true );
}

Assistant:

void P_AutoUseStrifeHealth (player_t *player)
{
	TArray<AInventory *> Items;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 3) Items.Push(inv);
		}
	}

	if (!sv_disableautohealth)
	{
		while (Items.Size() > 0)
		{
			int maxhealth = 0;
			int index = -1;

			// Find the largest item in the list
			for(unsigned i = 0; i < Items.Size(); i++)
			{
				if (Items[i]->health > maxhealth)
				{
					index = i;
					maxhealth = Items[i]->Amount;
				}
			}

			while (player->health < 50)
			{
				if (!player->mo->UseInventory (Items[index]))
					break;
			}
			if (player->health >= 50) return;
			// Using all of this item was not enough so delete it and restart with the next best one
			Items.Delete(index);
		}
	}
}